

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_14a1;
  long local_14a0;
  float local_1498;
  int local_1494;
  Ray *local_1490;
  RTCIntersectArguments *local_1488;
  ulong local_1480;
  RayQueryContext *local_1478;
  Geometry *local_1470;
  long local_1468;
  ulong local_1460;
  ulong *local_1458;
  ulong local_1450;
  long local_1448;
  Scene *local_1440;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 local_1424;
  uint local_1420;
  uint local_141c;
  uint local_1418;
  RTCFilterFunctionNArguments local_1408;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8;
  byte local_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  float fVar2;
  float fVar3;
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar4 = ray->tfar;
    if (0.0 <= fVar4) {
      local_1478 = context;
      local_1458 = local_11d0;
      aVar5 = (ray->dir).field_0;
      auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl((undefined1  [16])aVar5,auVar21);
      auVar22._8_4_ = 0x219392ef;
      auVar22._0_8_ = 0x219392ef219392ef;
      auVar22._12_4_ = 0x219392ef;
      uVar15 = vcmpps_avx512vl(auVar21,auVar22,1);
      auVar21 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar59 = ZEXT1664(auVar21);
      auVar21 = vdivps_avx512vl(auVar21,(undefined1  [16])aVar5);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar20 = (bool)((byte)uVar15 & 1);
      auVar30._0_4_ = (uint)bVar20 * auVar22._0_4_ | (uint)!bVar20 * auVar21._0_4_;
      bVar20 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar30._4_4_ = (uint)bVar20 * auVar22._4_4_ | (uint)!bVar20 * auVar21._4_4_;
      bVar20 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar30._8_4_ = (uint)bVar20 * auVar22._8_4_ | (uint)!bVar20 * auVar21._8_4_;
      bVar20 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar30._12_4_ = (uint)bVar20 * auVar22._12_4_ | (uint)!bVar20 * auVar21._12_4_;
      auVar23._8_4_ = 0x3f7ffffa;
      auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar23._12_4_ = 0x3f7ffffa;
      auVar23 = vmulps_avx512vl(auVar30,auVar23);
      auVar24._8_4_ = 0x3f800003;
      auVar24._0_8_ = 0x3f8000033f800003;
      auVar24._12_4_ = 0x3f800003;
      auVar24 = vmulps_avx512vl(auVar30,auVar24);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar60 = ZEXT3264(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar61 = ZEXT3264(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar62 = ZEXT3264(auVar43);
      auVar43 = vbroadcastss_avx512vl(auVar23);
      auVar63 = ZEXT3264(auVar43);
      auVar21 = vmovshdup_avx(auVar23);
      auVar43 = vbroadcastsd_avx512vl(auVar21);
      auVar64 = ZEXT3264(auVar43);
      auVar44._8_4_ = 2;
      auVar44._0_8_ = 0x200000002;
      auVar44._12_4_ = 2;
      auVar44._16_4_ = 2;
      auVar44._20_4_ = 2;
      auVar44._24_4_ = 2;
      auVar44._28_4_ = 2;
      auVar22 = vshufpd_avx(auVar23,auVar23,1);
      auVar43 = vpermps_avx2(auVar44,ZEXT1632(auVar23));
      auVar56 = ZEXT3264(auVar43);
      local_1218 = auVar24._0_4_;
      auVar43._8_4_ = 1;
      auVar43._0_8_ = 0x100000001;
      auVar43._12_4_ = 1;
      auVar43._16_4_ = 1;
      auVar43._20_4_ = 1;
      auVar43._24_4_ = 1;
      auVar43._28_4_ = 1;
      auVar43 = vpermps_avx2(auVar43,ZEXT1632(auVar24));
      auVar58 = ZEXT3264(auVar43);
      auVar43 = vpermps_avx2(auVar44,ZEXT1632(auVar24));
      auVar52 = ZEXT3264(auVar43);
      local_1460 = (ulong)(auVar23._0_4_ < 0.0) << 5;
      uVar17 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x40;
      uVar15 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
      uVar18 = local_1460 ^ 0x20;
      uVar48 = auVar42._0_4_;
      auVar50 = ZEXT3264(CONCAT428(uVar48,CONCAT424(uVar48,CONCAT420(uVar48,CONCAT416(uVar48,
                                                  CONCAT412(uVar48,CONCAT48(uVar48,CONCAT44(uVar48,
                                                  uVar48))))))));
      auVar54 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(
                                                  fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
      local_1490 = ray;
      fStack_1214 = local_1218;
      fStack_1210 = local_1218;
      fStack_120c = local_1218;
      fStack_1208 = local_1218;
      fStack_1204 = local_1218;
      fStack_1200 = local_1218;
      fStack_11fc = local_1218;
      do {
        uVar19 = local_1458[-1];
        local_1458 = local_1458 + -1;
        while( true ) {
          if ((uVar19 & 8) != 0) break;
          uVar12 = uVar19 & 0xfffffffffffffff0;
          uVar48 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 0xc);
          auVar47._4_4_ = uVar48;
          auVar47._0_4_ = uVar48;
          auVar47._8_4_ = uVar48;
          auVar47._12_4_ = uVar48;
          auVar47._16_4_ = uVar48;
          auVar47._20_4_ = uVar48;
          auVar47._24_4_ = uVar48;
          auVar47._28_4_ = uVar48;
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + local_1460),auVar47,
                                    *(undefined1 (*) [32])(uVar12 + 0x40 + local_1460));
          auVar43 = vsubps_avx512vl(ZEXT1632(auVar42),auVar60._0_32_);
          auVar43 = vmulps_avx512vl(auVar63._0_32_,auVar43);
          auVar43 = vmaxps_avx(auVar50._0_32_,auVar43);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar17),auVar47,
                                    *(undefined1 (*) [32])(uVar12 + 0x40 + uVar17));
          auVar44 = vsubps_avx512vl(ZEXT1632(auVar42),auVar61._0_32_);
          auVar44 = vmulps_avx512vl(auVar64._0_32_,auVar44);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar15),auVar47,
                                    *(undefined1 (*) [32])(uVar12 + 0x40 + uVar15));
          auVar45 = vsubps_avx512vl(ZEXT1632(auVar42),auVar62._0_32_);
          auVar46._4_4_ = auVar56._4_4_ * auVar45._4_4_;
          auVar46._0_4_ = auVar56._0_4_ * auVar45._0_4_;
          auVar46._8_4_ = auVar56._8_4_ * auVar45._8_4_;
          auVar46._12_4_ = auVar56._12_4_ * auVar45._12_4_;
          auVar46._16_4_ = auVar56._16_4_ * auVar45._16_4_;
          auVar46._20_4_ = auVar56._20_4_ * auVar45._20_4_;
          auVar46._24_4_ = auVar56._24_4_ * auVar45._24_4_;
          auVar46._28_4_ = auVar45._28_4_;
          auVar44 = vmaxps_avx(auVar44,auVar46);
          auVar43 = vmaxps_avx(auVar43,auVar44);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar18),auVar47,
                                    *(undefined1 (*) [32])(uVar12 + 0x40 + uVar18));
          auVar44 = vsubps_avx512vl(ZEXT1632(auVar42),auVar60._0_32_);
          auVar45._4_4_ = fStack_1214 * auVar44._4_4_;
          auVar45._0_4_ = local_1218 * auVar44._0_4_;
          auVar45._8_4_ = fStack_1210 * auVar44._8_4_;
          auVar45._12_4_ = fStack_120c * auVar44._12_4_;
          auVar45._16_4_ = fStack_1208 * auVar44._16_4_;
          auVar45._20_4_ = fStack_1204 * auVar44._20_4_;
          auVar45._24_4_ = fStack_1200 * auVar44._24_4_;
          auVar45._28_4_ = auVar44._28_4_;
          auVar44 = vminps_avx(auVar54._0_32_,auVar45);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar17 ^ 0x20)),auVar47
                                    ,*(undefined1 (*) [32])(uVar12 + 0x40 + (uVar17 ^ 0x20)));
          auVar46 = vsubps_avx512vl(ZEXT1632(auVar42),auVar61._0_32_);
          auVar10._4_4_ = auVar58._4_4_ * auVar46._4_4_;
          auVar10._0_4_ = auVar58._0_4_ * auVar46._0_4_;
          auVar10._8_4_ = auVar58._8_4_ * auVar46._8_4_;
          auVar10._12_4_ = auVar58._12_4_ * auVar46._12_4_;
          auVar10._16_4_ = auVar58._16_4_ * auVar46._16_4_;
          auVar10._20_4_ = auVar58._20_4_ * auVar46._20_4_;
          auVar10._24_4_ = auVar58._24_4_ * auVar46._24_4_;
          auVar10._28_4_ = auVar46._28_4_;
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar15 ^ 0x20)),auVar47
                                    ,*(undefined1 (*) [32])(uVar12 + 0x40 + (uVar15 ^ 0x20)));
          auVar46 = vsubps_avx512vl(ZEXT1632(auVar42),auVar62._0_32_);
          auVar11._4_4_ = auVar52._4_4_ * auVar46._4_4_;
          auVar11._0_4_ = auVar52._0_4_ * auVar46._0_4_;
          auVar11._8_4_ = auVar52._8_4_ * auVar46._8_4_;
          auVar11._12_4_ = auVar52._12_4_ * auVar46._12_4_;
          auVar11._16_4_ = auVar52._16_4_ * auVar46._16_4_;
          auVar11._20_4_ = auVar52._20_4_ * auVar46._20_4_;
          auVar11._24_4_ = auVar52._24_4_ * auVar46._24_4_;
          auVar11._28_4_ = auVar46._28_4_;
          auVar46 = vminps_avx(auVar10,auVar11);
          auVar44 = vminps_avx(auVar44,auVar46);
          if (((uint)uVar19 & 7) == 6) {
            uVar7 = vcmpps_avx512vl(auVar43,auVar44,2);
            uVar8 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(uVar12 + 0x1c0),0xd);
            uVar9 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(uVar12 + 0x1e0),1);
            uVar13 = (uint)uVar7 & (uint)uVar8 & (uint)uVar9;
          }
          else {
            uVar7 = vcmpps_avx512vl(auVar43,auVar44,2);
            uVar13 = (uint)uVar7;
          }
          if ((byte)uVar13 == 0) goto LAB_00694610;
          lVar16 = 0;
          for (uVar19 = (ulong)(byte)uVar13; (uVar19 & 1) == 0;
              uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar19 = *(ulong *)(uVar12 + lVar16 * 8);
          uVar13 = (uVar13 & 0xff) - 1 & uVar13 & 0xff;
          uVar14 = (ulong)uVar13;
          if (uVar13 != 0) {
            *local_1458 = uVar19;
            lVar16 = 0;
            for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar14 = (ulong)uVar13;
            bVar20 = uVar13 == 0;
            while( true ) {
              local_1458 = local_1458 + 1;
              uVar19 = *(ulong *)(uVar12 + lVar16 * 8);
              if (bVar20) break;
              *local_1458 = uVar19;
              lVar16 = 0;
              for (uVar19 = uVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              bVar20 = uVar14 == 0;
            }
          }
        }
        local_1468 = (ulong)((uint)uVar19 & 0xf) - 8;
        if (local_1468 != 0) {
          uVar19 = uVar19 & 0xfffffffffffffff0;
          local_1448 = 0;
          local_11f8 = auVar56._0_32_;
          local_1238 = auVar58._0_32_;
          local_1258 = auVar52._0_32_;
          local_1278 = auVar50._0_32_;
          local_1298 = auVar54._0_32_;
          do {
            local_14a0 = local_1448 * 0x140;
            uVar48 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 0xc);
            auVar33._4_4_ = uVar48;
            auVar33._0_4_ = uVar48;
            auVar33._8_4_ = uVar48;
            auVar33._12_4_ = uVar48;
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x90 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + local_14a0));
            auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xa0 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x10 + local_14a0));
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xb0 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x20 + local_14a0));
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xc0 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x30 + local_14a0));
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xd0 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x40 + local_14a0));
            auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xe0 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x50 + local_14a0));
            auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xf0 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x60 + local_14a0));
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x100 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x70 + local_14a0));
            auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x110 + local_14a0),auVar33,
                                      *(undefined1 (*) [16])(uVar19 + 0x80 + local_14a0));
            uVar48 = *(undefined4 *)&(local_1490->org).field_0;
            auVar34._4_4_ = uVar48;
            auVar34._0_4_ = uVar48;
            auVar34._8_4_ = uVar48;
            auVar34._12_4_ = uVar48;
            auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1490->org).field_0.m128[1]));
            auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1490->org).field_0.m128[2]));
            uVar48 = *(undefined4 *)&(local_1490->dir).field_0;
            auVar51._4_4_ = uVar48;
            auVar51._0_4_ = uVar48;
            auVar51._8_4_ = uVar48;
            auVar51._12_4_ = uVar48;
            uVar48 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 4);
            auVar55._4_4_ = uVar48;
            auVar55._0_4_ = uVar48;
            auVar55._8_4_ = uVar48;
            auVar55._12_4_ = uVar48;
            fVar4 = (local_1490->dir).field_0.m128[2];
            auVar57._4_4_ = fVar4;
            auVar57._0_4_ = fVar4;
            auVar57._8_4_ = fVar4;
            auVar57._12_4_ = fVar4;
            auVar42 = vsubps_avx(auVar42,auVar34);
            auVar27 = vsubps_avx512vl(auVar21,auVar25);
            auVar28 = vsubps_avx512vl(auVar22,auVar26);
            auVar29 = vsubps_avx512vl(auVar23,auVar34);
            auVar24 = vsubps_avx512vl(auVar24,auVar25);
            auVar30 = vsubps_avx512vl(auVar30,auVar26);
            auVar31 = vsubps_avx512vl(auVar31,auVar34);
            auVar32 = vsubps_avx512vl(auVar32,auVar25);
            auVar33 = vsubps_avx512vl(auVar33,auVar26);
            auVar25 = vsubps_avx512vl(auVar31,auVar42);
            auVar21 = vsubps_avx(auVar32,auVar27);
            auVar22 = vsubps_avx(auVar33,auVar28);
            auVar26 = vsubps_avx512vl(auVar42,auVar29);
            auVar34 = vsubps_avx512vl(auVar27,auVar24);
            auVar35 = vsubps_avx512vl(auVar28,auVar30);
            auVar36 = vsubps_avx512vl(auVar29,auVar31);
            auVar37 = vsubps_avx512vl(auVar24,auVar32);
            auVar38 = vsubps_avx512vl(auVar30,auVar33);
            auVar23 = vaddps_avx512vl(auVar31,auVar42);
            auVar53._0_4_ = auVar32._0_4_ + auVar27._0_4_;
            auVar53._4_4_ = auVar32._4_4_ + auVar27._4_4_;
            auVar53._8_4_ = auVar32._8_4_ + auVar27._8_4_;
            auVar53._12_4_ = auVar32._12_4_ + auVar27._12_4_;
            auVar39 = vaddps_avx512vl(auVar33,auVar28);
            auVar40 = vmulps_avx512vl(auVar53,auVar22);
            auVar40 = vfmsub231ps_avx512vl(auVar40,auVar21,auVar39);
            auVar39 = vmulps_avx512vl(auVar39,auVar25);
            auVar39 = vfmsub231ps_avx512vl(auVar39,auVar22,auVar23);
            auVar41._0_4_ = auVar21._0_4_ * auVar23._0_4_;
            auVar41._4_4_ = auVar21._4_4_ * auVar23._4_4_;
            auVar41._8_4_ = auVar21._8_4_ * auVar23._8_4_;
            auVar41._12_4_ = auVar21._12_4_ * auVar23._12_4_;
            auVar23 = vfmsub231ps_fma(auVar41,auVar25,auVar53);
            auVar49._0_4_ = fVar4 * auVar23._0_4_;
            auVar49._4_4_ = fVar4 * auVar23._4_4_;
            auVar49._8_4_ = fVar4 * auVar23._8_4_;
            auVar49._12_4_ = fVar4 * auVar23._12_4_;
            auVar23 = vfmadd231ps_avx512vl(auVar49,auVar55,auVar39);
            local_13d8 = vfmadd231ps_avx512vl(auVar23,auVar51,auVar40);
            auVar23 = vaddps_avx512vl(auVar42,auVar29);
            auVar39 = vaddps_avx512vl(auVar27,auVar24);
            auVar40 = vaddps_avx512vl(auVar28,auVar30);
            auVar41 = vmulps_avx512vl(auVar39,auVar35);
            auVar41 = vfmsub231ps_avx512vl(auVar41,auVar34,auVar40);
            auVar40 = vmulps_avx512vl(auVar40,auVar26);
            auVar40 = vfmsub231ps_avx512vl(auVar40,auVar35,auVar23);
            auVar23 = vmulps_avx512vl(auVar23,auVar34);
            auVar23 = vfmsub231ps_avx512vl(auVar23,auVar26,auVar39);
            auVar39._0_4_ = fVar4 * auVar23._0_4_;
            auVar39._4_4_ = fVar4 * auVar23._4_4_;
            auVar39._8_4_ = fVar4 * auVar23._8_4_;
            auVar39._12_4_ = fVar4 * auVar23._12_4_;
            auVar23 = vfmadd231ps_avx512vl(auVar39,auVar55,auVar40);
            local_13c8 = vfmadd231ps_avx512vl(auVar23,auVar51,auVar41);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar31 = vaddps_avx512vl(auVar29,auVar31);
            auVar24 = vaddps_avx512vl(auVar24,auVar32);
            auVar30 = vaddps_avx512vl(auVar30,auVar33);
            auVar32 = vmulps_avx512vl(auVar24,auVar38);
            auVar32 = vfmsub231ps_avx512vl(auVar32,auVar37,auVar30);
            auVar40._0_4_ = auVar30._0_4_ * auVar36._0_4_;
            auVar40._4_4_ = auVar30._4_4_ * auVar36._4_4_;
            auVar40._8_4_ = auVar30._8_4_ * auVar36._8_4_;
            auVar40._12_4_ = auVar30._12_4_ * auVar36._12_4_;
            auVar30 = vfmsub231ps_avx512vl(auVar40,auVar38,auVar31);
            auVar31 = vmulps_avx512vl(auVar31,auVar37);
            auVar24 = vfmsub231ps_avx512vl(auVar31,auVar36,auVar24);
            auVar24 = vmulps_avx512vl(auVar57,auVar24);
            auVar24 = vfmadd231ps_avx512vl(auVar24,auVar55,auVar30);
            auVar24 = vfmadd231ps_avx512vl(auVar24,auVar51,auVar32);
            auVar29._0_4_ = local_13d8._0_4_ + local_13c8._0_4_;
            auVar29._4_4_ = local_13d8._4_4_ + local_13c8._4_4_;
            auVar29._8_4_ = local_13d8._8_4_ + local_13c8._8_4_;
            auVar29._12_4_ = local_13d8._12_4_ + local_13c8._12_4_;
            local_13b8 = vaddps_avx512vl(auVar24,auVar29);
            auVar30 = vandps_avx512vl(local_13b8,auVar23);
            auVar31._8_4_ = 0x34000000;
            auVar31._0_8_ = 0x3400000034000000;
            auVar31._12_4_ = 0x34000000;
            auVar31 = vmulps_avx512vl(auVar30,auVar31);
            auVar32 = vminps_avx512vl(local_13d8,local_13c8);
            auVar33 = vminps_avx512vl(auVar32,auVar24);
            auVar32._8_4_ = 0x80000000;
            auVar32._0_8_ = 0x8000000080000000;
            auVar32._12_4_ = 0x80000000;
            auVar32 = vxorps_avx512vl(auVar31,auVar32);
            uVar7 = vcmpps_avx512vl(auVar33,auVar32,5);
            auVar32 = vmaxps_avx512vl(local_13d8,local_13c8);
            auVar24 = vmaxps_avx512vl(auVar32,auVar24);
            uVar8 = vcmpps_avx512vl(auVar24,auVar31,2);
            local_13a0 = ((byte)uVar7 | (byte)uVar8) & 0xf;
            if (local_13a0 != 0) {
              auVar24 = vmulps_avx512vl(auVar22,auVar34);
              auVar31 = vmulps_avx512vl(auVar25,auVar35);
              auVar32 = vmulps_avx512vl(auVar21,auVar26);
              auVar33 = vmulps_avx512vl(auVar35,auVar37);
              auVar29 = vmulps_avx512vl(auVar26,auVar38);
              auVar39 = vmulps_avx512vl(auVar34,auVar36);
              auVar21 = vfmsub213ps_avx512vl(auVar21,auVar35,auVar24);
              auVar22 = vfmsub213ps_avx512vl(auVar22,auVar26,auVar31);
              auVar25 = vfmsub213ps_avx512vl(auVar25,auVar34,auVar32);
              auVar34 = vfmsub213ps_avx512vl(auVar38,auVar34,auVar33);
              auVar35 = vfmsub213ps_avx512vl(auVar36,auVar35,auVar29);
              auVar26 = vfmsub213ps_avx512vl(auVar37,auVar26,auVar39);
              auVar24 = vandps_avx512vl(auVar24,auVar23);
              auVar33 = vandps_avx512vl(auVar33,auVar23);
              uVar12 = vcmpps_avx512vl(auVar24,auVar33,1);
              auVar24 = vandps_avx512vl(auVar31,auVar23);
              auVar31 = vandps_avx512vl(auVar29,auVar23);
              uVar14 = vcmpps_avx512vl(auVar24,auVar31,1);
              auVar24 = vandps_avx512vl(auVar32,auVar23);
              auVar23 = vandps_avx512vl(auVar39,auVar23);
              uVar6 = vcmpps_avx512vl(auVar24,auVar23,1);
              bVar20 = (bool)((byte)uVar12 & 1);
              local_1368._0_4_ = (uint)bVar20 * auVar21._0_4_ | (uint)!bVar20 * auVar34._0_4_;
              bVar20 = (bool)((byte)(uVar12 >> 1) & 1);
              local_1368._4_4_ = (uint)bVar20 * auVar21._4_4_ | (uint)!bVar20 * auVar34._4_4_;
              bVar20 = (bool)((byte)(uVar12 >> 2) & 1);
              local_1368._8_4_ = (uint)bVar20 * auVar21._8_4_ | (uint)!bVar20 * auVar34._8_4_;
              bVar20 = (bool)((byte)(uVar12 >> 3) & 1);
              local_1368._12_4_ = (uint)bVar20 * auVar21._12_4_ | (uint)!bVar20 * auVar34._12_4_;
              bVar20 = (bool)((byte)uVar14 & 1);
              local_1358._0_4_ = (uint)bVar20 * auVar22._0_4_ | (uint)!bVar20 * auVar35._0_4_;
              bVar20 = (bool)((byte)(uVar14 >> 1) & 1);
              local_1358._4_4_ = (uint)bVar20 * auVar22._4_4_ | (uint)!bVar20 * auVar35._4_4_;
              bVar20 = (bool)((byte)(uVar14 >> 2) & 1);
              local_1358._8_4_ = (uint)bVar20 * auVar22._8_4_ | (uint)!bVar20 * auVar35._8_4_;
              bVar20 = (bool)((byte)(uVar14 >> 3) & 1);
              local_1358._12_4_ = (uint)bVar20 * auVar22._12_4_ | (uint)!bVar20 * auVar35._12_4_;
              bVar20 = (bool)((byte)uVar6 & 1);
              local_1348._0_4_ =
                   (float)((uint)bVar20 * auVar25._0_4_ | (uint)!bVar20 * auVar26._0_4_);
              bVar20 = (bool)((byte)(uVar6 >> 1) & 1);
              local_1348._4_4_ =
                   (float)((uint)bVar20 * auVar25._4_4_ | (uint)!bVar20 * auVar26._4_4_);
              bVar20 = (bool)((byte)(uVar6 >> 2) & 1);
              local_1348._8_4_ =
                   (float)((uint)bVar20 * auVar25._8_4_ | (uint)!bVar20 * auVar26._8_4_);
              bVar20 = (bool)((byte)(uVar6 >> 3) & 1);
              local_1348._12_4_ =
                   (float)((uint)bVar20 * auVar25._12_4_ | (uint)!bVar20 * auVar26._12_4_);
              auVar37._0_4_ = fVar4 * local_1348._0_4_;
              auVar37._4_4_ = fVar4 * local_1348._4_4_;
              auVar37._8_4_ = fVar4 * local_1348._8_4_;
              auVar37._12_4_ = fVar4 * local_1348._12_4_;
              auVar21 = vfmadd213ps_fma(auVar55,local_1358,auVar37);
              auVar21 = vfmadd213ps_fma(auVar51,local_1368,auVar21);
              auVar35._0_4_ = auVar21._0_4_ + auVar21._0_4_;
              auVar35._4_4_ = auVar21._4_4_ + auVar21._4_4_;
              auVar35._8_4_ = auVar21._8_4_ + auVar21._8_4_;
              auVar35._12_4_ = auVar21._12_4_ + auVar21._12_4_;
              auVar36._0_4_ = auVar28._0_4_ * local_1348._0_4_;
              auVar36._4_4_ = auVar28._4_4_ * local_1348._4_4_;
              auVar36._8_4_ = auVar28._8_4_ * local_1348._8_4_;
              auVar36._12_4_ = auVar28._12_4_ * local_1348._12_4_;
              auVar21 = vfmadd213ps_fma(auVar27,local_1358,auVar36);
              auVar21 = vfmadd213ps_fma(auVar42,local_1368,auVar21);
              auVar42 = vrcp14ps_avx512vl(auVar35);
              auVar23 = auVar59._0_16_;
              auVar22 = vfnmadd213ps_avx512vl(auVar42,auVar35,auVar23);
              auVar42 = vfmadd132ps_fma(auVar22,auVar42,auVar42);
              local_1378._0_4_ = auVar42._0_4_ * (auVar21._0_4_ + auVar21._0_4_);
              local_1378._4_4_ = auVar42._4_4_ * (auVar21._4_4_ + auVar21._4_4_);
              local_1378._8_4_ = auVar42._8_4_ * (auVar21._8_4_ + auVar21._8_4_);
              local_1378._12_4_ = auVar42._12_4_ * (auVar21._12_4_ + auVar21._12_4_);
              uVar48 = *(undefined4 *)((long)&(local_1490->org).field_0 + 0xc);
              auVar42._4_4_ = uVar48;
              auVar42._0_4_ = uVar48;
              auVar42._8_4_ = uVar48;
              auVar42._12_4_ = uVar48;
              uVar7 = vcmpps_avx512vl(local_1378,auVar42,0xd);
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar42 = vxorps_avx512vl(auVar35,auVar25);
              fVar4 = local_1490->tfar;
              auVar26._4_4_ = fVar4;
              auVar26._0_4_ = fVar4;
              auVar26._8_4_ = fVar4;
              auVar26._12_4_ = fVar4;
              uVar8 = vcmpps_avx512vl(local_1378,auVar26,2);
              uVar9 = vcmpps_avx512vl(auVar35,auVar42,4);
              local_13a0 = (byte)uVar7 & (byte)uVar8 & (byte)uVar9 & local_13a0;
              if (local_13a0 != 0) {
                local_14a0 = local_14a0 + uVar19;
                local_13a8 = &local_14a1;
                auVar27._8_4_ = 0x219392ef;
                auVar27._0_8_ = 0x219392ef219392ef;
                auVar27._12_4_ = 0x219392ef;
                uVar12 = vcmpps_avx512vl(auVar30,auVar27,5);
                auVar42 = vrcp14ps_avx512vl(local_13b8);
                auVar21 = vfnmadd213ps_avx512vl(local_13b8,auVar42,auVar23);
                auVar42 = vfmadd132ps_avx512vl(auVar21,auVar42,auVar42);
                fVar4 = (float)((uint)((byte)uVar12 & 1) * auVar42._0_4_);
                fVar1 = (float)((uint)((byte)(uVar12 >> 1) & 1) * auVar42._4_4_);
                fVar2 = (float)((uint)((byte)(uVar12 >> 2) & 1) * auVar42._8_4_);
                fVar3 = (float)((uint)((byte)(uVar12 >> 3) & 1) * auVar42._12_4_);
                auVar28._0_4_ = fVar4 * local_13d8._0_4_;
                auVar28._4_4_ = fVar1 * local_13d8._4_4_;
                auVar28._8_4_ = fVar2 * local_13d8._8_4_;
                auVar28._12_4_ = fVar3 * local_13d8._12_4_;
                local_1398 = vminps_avx512vl(auVar28,auVar23);
                auVar38._0_4_ = fVar4 * local_13c8._0_4_;
                auVar38._4_4_ = fVar1 * local_13c8._4_4_;
                auVar38._8_4_ = fVar2 * local_13c8._8_4_;
                auVar38._12_4_ = fVar3 * local_13c8._12_4_;
                local_1388 = vminps_avx512vl(auVar38,auVar23);
                local_1450 = (ulong)local_13a0;
                local_1440 = local_1478->scene;
                do {
                  local_1480 = 0;
                  for (uVar12 = local_1450; (uVar12 & 1) == 0;
                      uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                    local_1480 = local_1480 + 1;
                  }
                  local_1420 = *(uint *)(local_14a0 + 0x120 + local_1480 * 4);
                  local_1470 = (local_1440->geometries).items[local_1420].ptr;
                  if ((local_1470->mask & local_1490->mask) == 0) {
                    local_1450 = local_1450 ^ 1L << (local_1480 & 0x3f);
                  }
                  else {
                    if ((local_1478->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1470->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00694620:
                      local_1490->tfar = -INFINITY;
                      return;
                    }
                    local_1488 = local_1478->args;
                    local_1338 = auVar64._0_32_;
                    local_1318 = auVar63._0_32_;
                    local_12f8 = auVar62._0_32_;
                    local_12d8 = auVar61._0_32_;
                    local_12b8 = auVar60._0_32_;
                    uVar12 = (ulong)(uint)((int)local_1480 * 4);
                    local_1408.context = local_1478->user;
                    local_1438 = *(undefined4 *)(local_1368 + uVar12);
                    local_1434 = *(undefined4 *)(local_1358 + uVar12);
                    local_1430 = *(undefined4 *)(local_1348 + uVar12);
                    local_142c = *(undefined4 *)(local_1398 + uVar12);
                    local_1428 = *(undefined4 *)(local_1388 + uVar12);
                    local_1424 = *(undefined4 *)(local_14a0 + 0x130 + uVar12);
                    local_141c = (local_1408.context)->instID[0];
                    local_1418 = (local_1408.context)->instPrimID[0];
                    local_1498 = local_1490->tfar;
                    local_1490->tfar = *(float *)(local_1378 + uVar12);
                    local_1494 = -1;
                    local_1408.valid = &local_1494;
                    local_1408.geometryUserPtr = local_1470->userPtr;
                    local_1408.hit = (RTCHitN *)&local_1438;
                    local_1408.N = 1;
                    local_1408.ray = (RTCRayN *)local_1490;
                    if (((local_1470->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1470->occlusionFilterN)(&local_1408), *local_1408.valid != 0)) &&
                       ((local_1488->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_1488->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1470->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_1488->filter)(&local_1408), *local_1408.valid != 0))))))
                    goto LAB_00694620;
                    local_1490->tfar = local_1498;
                    local_1450 = local_1450 ^ 1L << (local_1480 & 0x3f);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar59 = ZEXT1664(auVar42);
                    auVar60 = ZEXT3264(local_12b8);
                    auVar61 = ZEXT3264(local_12d8);
                    auVar62 = ZEXT3264(local_12f8);
                    auVar63 = ZEXT3264(local_1318);
                    auVar64 = ZEXT3264(local_1338);
                  }
                } while (local_1450 != 0);
              }
            }
            local_1448 = local_1448 + 1;
            auVar56 = ZEXT3264(local_11f8);
            auVar58 = ZEXT3264(local_1238);
            auVar52 = ZEXT3264(local_1258);
            auVar50 = ZEXT3264(local_1278);
            auVar54 = ZEXT3264(local_1298);
          } while (local_1448 != local_1468);
        }
LAB_00694610:
      } while (local_1458 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }